

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegisterHasNoReset.cpp
# Opt level: O2

string * __thiscall
RegisterHasNoReset::description_abi_cxx11_(string *__return_storage_ptr__,RegisterHasNoReset *this)

{
  size_t in_R8;
  format_string<> fmt;
  format_string<> fmt_00;
  string sStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  v11 local_38 [4];
  undefined1 local_34;
  undefined1 local_30;
  undefined1 local_2c;
  undefined2 local_28;
  undefined1 local_26;
  v11 local_24 [4];
  undefined1 local_20;
  undefined1 local_1c;
  undefined1 local_18;
  undefined2 local_14;
  undefined1 local_12;
  
  local_24[0] = (v11)0x0;
  local_20 = 0;
  local_1c = 0;
  local_18 = 0;
  local_14 = 0;
  local_12 = 4;
  fmt.str.size_ = in_R8;
  fmt.str.data_ = (char *)0x149;
  ::fmt::v11::format<>
            (&local_58,local_24,
             (text_style *)
             "module m (logic clk, logic reset);\n    logic r;\n    always_ff @(posedge clk or negedge reset) begin\n                               ^^^^^^^^^^^^^------\\\n                                                  \\\n        r <= 1\'b1;                                \\\n        ^~~~Register r do not have a value when reset\n    end\nendmodule\n\n"
             ,fmt);
  std::operator+(&local_98,
                 "A register in an always_ff, which contains the reset signal on its sensitivity list, which\ndo not have a value when the design is on reset. This will cause errors with synthesis\ntools since they will use an incorrect register cell.\n\n"
                 ,&local_58);
  std::operator+(&local_78,&local_98,"Instead the always_ff should be written like this:\n\n");
  local_38[0] = (v11)0x0;
  local_34 = 0;
  local_30 = 0;
  local_2c = 0;
  local_28 = 0;
  local_26 = 4;
  fmt_00.str.size_ = in_R8;
  fmt_00.str.data_ = (char *)0x78;
  ::fmt::v11::format<>
            (&sStack_b8,local_38,
             (text_style *)
             "module m (logic clk, logic reset);\n    logic r;\n    always_ff @(posedge clk) begin\n        r <= 1\'b1;\n    end\nendmodule\n"
             ,fmt_00);
  std::operator+(__return_storage_ptr__,&local_78,&sStack_b8);
  std::__cxx11::string::~string((string *)&sStack_b8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string description() const override {
        return "A register in an always_ff, which contains the reset signal on its sensitivity "
               "list, which\ndo not have a value when the design is on reset. This will cause "
               "errors with "
               "synthesis\ntools since they will use an incorrect register cell.\n\n" +
               fmt::format(fmt::emphasis::italic,
                           "module m (logic clk, logic reset);\n"
                           "    logic r;\n"
                           "    always_ff @(posedge clk or negedge reset) begin\n"
                           "                               ^^^^^^^^^^^^^------\\\n"
                           "                                                  \\\n"
                           "        r <= 1'b1;                                \\\n"
                           "        ^~~~Register r do not have a value when reset\n"
                           "    end\n"
                           "endmodule\n\n") +
               "Instead the always_ff should be written like this:\n\n" +
               fmt::format(fmt::emphasis::italic, "module m (logic clk, logic reset);\n"
                                                  "    logic r;\n"
                                                  "    always_ff @(posedge clk) begin\n"
                                                  "        r <= 1'b1;\n"
                                                  "    end\n"
                                                  "endmodule\n");
    }